

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

ErrorPolicy llvm::DWARFContext::defaultErrorHandler(Error *E)

{
  raw_ostream *prVar1;
  Error *E_00;
  Error local_38;
  string local_30;
  Error *local_10;
  Error *E_local;
  
  local_10 = E;
  prVar1 = WithColor::error();
  Error::Error(&local_38,E);
  toString_abi_cxx11_(&local_30,(llvm *)&local_38,E_00);
  prVar1 = raw_ostream::operator<<(prVar1,&local_30);
  raw_ostream::operator<<(prVar1,'\n');
  std::__cxx11::string::~string((string *)&local_30);
  Error::~Error(&local_38);
  return Continue;
}

Assistant:

ErrorPolicy DWARFContext::defaultErrorHandler(Error E) {
  WithColor::error() << toString(std::move(E)) << '\n';
  return ErrorPolicy::Continue;
}